

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Decoration __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::TranslateNonUniformDecoration
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  Decoration DVar1;
  Capability local_c;
  
  DVar1 = DecorationMax;
  if (((uint)coherentFlags >> 10 & 1) != 0) {
    if ((this->builder).spvVersion < 0x10500) {
      spv::Builder::addExtension(&this->builder,"SPV_EXT_descriptor_indexing");
    }
    local_c = CapabilityShaderNonUniform;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&local_c);
    DVar1 = DecorationNonUniform;
  }
  return DVar1;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateNonUniformDecoration(
    const spv::Builder::AccessChain::CoherentFlags& coherentFlags)
{
    if (coherentFlags.isNonUniform()) {
        builder.addIncorporatedExtension("SPV_EXT_descriptor_indexing", spv::Spv_1_5);
        builder.addCapability(spv::CapabilityShaderNonUniformEXT);
        return spv::DecorationNonUniformEXT;
    } else
        return spv::DecorationMax;
}